

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qregion.cpp
# Opt level: O3

void __thiscall QRegionPrivate::intersect(QRegionPrivate *this,QRect *rect)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  Representation RVar8;
  Representation RVar9;
  Representation RVar10;
  pointer pQVar11;
  ulong uVar12;
  int iVar13;
  ulong uVar14;
  ulong uVar15;
  pointer pQVar16;
  pointer pQVar17;
  int iVar18;
  QRect *prev;
  int iVar19;
  int iVar20;
  ulong uVar21;
  undefined1 auVar22 [16];
  
  auVar22 = QRect::normalized();
  (this->extents).x1 = 0;
  (this->extents).y1 = 0;
  (this->extents).x2 = -1;
  (this->extents).y2 = -1;
  (this->innerRect).x1 = 0;
  (this->innerRect).y1 = 0;
  (this->innerRect).x2 = -1;
  (this->innerRect).y2 = -1;
  this->innerArea = -1;
  pQVar11 = QList<QRect>::data(&this->rects);
  iVar19 = this->numRects;
  this->numRects = 0;
  if (iVar19 == 0) {
    return;
  }
  pQVar16 = pQVar11;
LAB_0042b398:
  iVar18 = 1 - iVar19;
  pQVar17 = pQVar16;
  do {
    pQVar16 = pQVar17 + 1;
    uVar5 = (pQVar17->x1).m_i;
    uVar6 = (pQVar17->y1).m_i;
    uVar21 = (ulong)uVar5;
    if ((int)uVar5 <= auVar22._0_4_) {
      uVar21 = auVar22._0_8_ & 0xffffffff;
    }
    uVar5 = (pQVar17->x2).m_i;
    uVar15 = (ulong)uVar5;
    if (auVar22._8_4_ <= (int)uVar5) {
      uVar15 = auVar22._8_8_ & 0xffffffff;
    }
    uVar12 = (ulong)uVar6;
    if ((int)uVar6 <= auVar22._4_4_) {
      uVar12 = auVar22._0_8_ >> 0x20;
    }
    uVar5 = (pQVar17->y2).m_i;
    uVar14 = (ulong)uVar5;
    if (auVar22._12_4_ <= (int)uVar5) {
      uVar14 = auVar22._8_8_ >> 0x20;
    }
    *(ulong *)pQVar11 = (uVar12 << 0x20) + uVar21;
    *(ulong *)&pQVar11->x2 = (uVar14 << 0x20) + uVar15;
    iVar19 = (int)uVar21;
    if ((iVar19 <= (int)uVar15) && ((int)uVar12 <= (int)uVar14)) {
      iVar20 = this->numRects;
      if (iVar20 == 0) {
        RVar8.m_i = (pQVar11->y1).m_i;
        RVar9.m_i = (pQVar11->x2).m_i;
        RVar10.m_i = (pQVar11->y2).m_i;
        (this->extents).x1 = (Representation)(pQVar11->x1).m_i;
        (this->extents).y1 = (Representation)RVar8.m_i;
        (this->extents).x2 = (Representation)RVar9.m_i;
        (this->extents).y2 = (Representation)RVar10.m_i;
        iVar20 = 1;
        goto LAB_0042b4cb;
      }
      iVar13 = (this->extents).x1.m_i;
      iVar7 = (this->extents).x2.m_i;
      if (iVar13 < iVar19) {
        iVar19 = iVar13;
      }
      (this->extents).x1.m_i = iVar19;
      iVar19 = (pQVar11->x2).m_i;
      if (iVar19 < iVar7) {
        iVar19 = iVar7;
      }
      (this->extents).x2.m_i = iVar19;
      iVar19 = (this->extents).y2.m_i;
      iVar13 = (pQVar11->y2).m_i;
      if (iVar13 < iVar19) {
        iVar13 = iVar19;
      }
      (this->extents).y2.m_i = iVar13;
      if (((((1 < iVar20) && (pQVar11[-2].y1.m_i == pQVar11[-1].y1.m_i)) ||
           (iVar19 = (pQVar11->y1).m_i, pQVar11[-1].y2.m_i < iVar19 + -1)) ||
          ((iVar13 = pQVar11[-1].x1.m_i, iVar13 != (pQVar11->x1).m_i ||
           (iVar7 = pQVar11[-1].x2.m_i, iVar7 != (pQVar11->x2).m_i)))) ||
         ((iVar18 != 0 && ((pQVar17[1].y1.m_i == iVar19 && ((pQVar16->x1).m_i <= auVar22._8_4_))))))
      break;
      iVar19 = (pQVar11->y2).m_i;
      pQVar11[-1].y2.m_i = iVar19;
      iVar19 = ((iVar19 - pQVar11[-1].y1.m_i) + 1) * ((iVar7 - iVar13) + 1);
      if (this->innerArea < iVar19) {
        this->innerArea = iVar19;
        iVar19 = pQVar11[-1].y1.m_i;
        iVar20 = pQVar11[-1].x2.m_i;
        iVar13 = pQVar11[-1].y2.m_i;
        (this->innerRect).x1.m_i = pQVar11[-1].x1.m_i;
        (this->innerRect).y1.m_i = iVar19;
        (this->innerRect).x2.m_i = iVar20;
        (this->innerRect).y2.m_i = iVar13;
      }
    }
    iVar18 = iVar18 + 1;
    pQVar17 = pQVar16;
    if (iVar18 == 1) {
      return;
    }
  } while( true );
  iVar20 = iVar20 + 1;
LAB_0042b4cb:
  uVar1 = pQVar11->x2;
  uVar3 = pQVar11->y2;
  uVar2 = pQVar11->x1;
  uVar4 = pQVar11->y1;
  iVar19 = ((uVar3 - uVar4) + 1) * ((uVar1 - uVar2) + 1);
  if (this->innerArea < iVar19) {
    this->innerArea = iVar19;
    iVar19 = (pQVar11->y1).m_i;
    iVar13 = (pQVar11->x2).m_i;
    iVar7 = (pQVar11->y2).m_i;
    (this->innerRect).x1.m_i = (pQVar11->x1).m_i;
    (this->innerRect).y1.m_i = iVar19;
    (this->innerRect).x2.m_i = iVar13;
    (this->innerRect).y2.m_i = iVar7;
  }
  iVar19 = -iVar18;
  pQVar11 = pQVar11 + 1;
  this->numRects = iVar20;
  if (iVar18 == 0) {
    return;
  }
  goto LAB_0042b398;
}

Assistant:

void QRegionPrivate::intersect(const QRect &rect)
{
    Q_ASSERT(extents.intersects(rect));
    Q_ASSERT(numRects > 1);

#ifdef QT_REGION_DEBUG
    selfTest();
#endif

    const QRect r = rect.normalized();
    extents = QRect();
    innerRect = QRect();
    innerArea = -1;

    QRect *dest = rects.data();
    const QRect *src = dest;
    int n = numRects;
    numRects = 0;
    while (n--) {
        *dest = qt_rect_intersect_normalized(*src++, r);
        if (dest->isEmpty())
            continue;

        if (numRects == 0) {
            extents = *dest;
        } else {
            extents.setLeft(qMin(extents.left(), dest->left()));
            // hw: extents.top() will never change after initialization
            //extents.setTop(qMin(extents.top(), dest->top()));
            extents.setRight(qMax(extents.right(), dest->right()));
            extents.setBottom(qMax(extents.bottom(), dest->bottom()));

            const QRect *nextToLast = (numRects > 1 ? dest - 2 : nullptr);

            // mergeFromBelow inlined and optimized
            if (canMergeFromBelow(dest - 1, dest, nextToLast, nullptr)) {
                if (!n || src->y() != dest->y() || src->left() > r.right()) {
                    QRect *prev = dest - 1;
                    prev->setBottom(dest->bottom());
                    updateInnerRect(*prev);
                    continue;
                }
            }
        }
        updateInnerRect(*dest);
        ++dest;
        ++numRects;
    }
#ifdef QT_REGION_DEBUG
    selfTest();
#endif
}